

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

int t_pool_dispatch2(t_pool *p,t_results_queue *q,_func_void_ptr_void_ptr *func,void *arg,
                    int nonblock)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int *piVar2;
  t_pool_job *ptVar3;
  t_pool_job **pptVar4;
  
  __mutex = &p->pool_m;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((nonblock == 1) && (p->qsize <= p->njobs)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    piVar2 = __errno_location();
    *piVar2 = 0xb;
  }
  else {
    ptVar3 = (t_pool_job *)malloc(0x30);
    if (ptVar3 != (t_pool_job *)0x0) {
      ptVar3->func = func;
      ptVar3->arg = arg;
      ptVar3->next = (t_pool_job *)0x0;
      ptVar3->p = p;
      ptVar3->q = q;
      if (q == (t_results_queue *)0x0) {
        ptVar3->serial = 0;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)&q->result_m);
        ptVar3->serial = q->curr_serial;
        pthread_mutex_unlock((pthread_mutex_t *)&q->result_m);
        pthread_mutex_lock((pthread_mutex_t *)&q->result_m);
        q->curr_serial = q->curr_serial + 1;
        q->pending = q->pending + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&q->result_m);
      }
      if ((nonblock == 0) && (p->qsize <= p->njobs)) {
        do {
          pthread_cond_wait((pthread_cond_t *)&p->full_c,(pthread_mutex_t *)__mutex);
        } while (p->qsize <= p->njobs);
      }
      iVar1 = p->njobs;
      p->njobs = iVar1 + 1;
      if (p->tail == (t_pool_job *)0x0) {
        p->tail = ptVar3;
        pptVar4 = &p->head;
      }
      else {
        pptVar4 = &p->tail;
        p->tail->next = ptVar3;
      }
      *pptVar4 = ptVar3;
      if ((-1 < (long)p->t_stack_top) && (p->tsize - p->nwaiting <= iVar1)) {
        pthread_cond_signal((pthread_cond_t *)&p->t[p->t_stack_top].pending_c);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0;
    }
  }
  return -1;
}

Assistant:

int t_pool_dispatch2(t_pool *p, t_results_queue *q,
		     void *(*func)(void *arg), void *arg, int nonblock) {
    t_pool_job *j;

#ifdef DEBUG
    fprintf(stderr, "Dispatching job for queue %p, serial %d\n", q, q->curr_serial);
#endif

    pthread_mutex_lock(&p->pool_m);

    if (p->njobs >= p->qsize && nonblock == 1) {
	pthread_mutex_unlock(&p->pool_m);
	errno = EAGAIN;
	return -1;
    }

    if (!(j = malloc(sizeof(*j))))
	return -1;
    j->func = func;
    j->arg = arg;
    j->next = NULL;
    j->p = p;
    j->q = q;
    if (q) {
	pthread_mutex_lock(&q->result_m);
	j->serial = q->curr_serial;
	pthread_mutex_unlock(&q->result_m);
    } else {
	j->serial = 0;
    }

    if (q) {
	pthread_mutex_lock(&q->result_m);
	q->curr_serial++;
	q->pending++;
	pthread_mutex_unlock(&q->result_m);
    }

    // Check if queue is full
    if (nonblock == 0)
	while (p->njobs >= p->qsize)
	    pthread_cond_wait(&p->full_c, &p->pool_m);

    p->njobs++;
    
//    if (q->curr_serial % 100 == 0)
//	fprintf(stderr, "p->njobs = %d    p->qsize = %d\n", p->njobs, p->qsize);

    if (p->tail) {
	p->tail->next = j;
	p->tail = j;
    } else {
	p->head = p->tail = j;
    }

#ifdef DEBUG
    fprintf(stderr, "Dispatched (serial %d)\n", j->serial);
#endif

    // Let a worker know we have data.
#ifdef IN_ORDER
    // Keep incoming queue at 1 per running thread, so there is always
    // something waiting when they end their current task.  If we go above
    // this signal to start more threads (if available). This has the effect
    // of concentrating jobs to fewer cores when we are I/O bound, which in
    // turn benefits systems with auto CPU frequency scaling.
    if (p->t_stack_top >= 0 && p->njobs > p->tsize - p->nwaiting)
	pthread_cond_signal(&p->t[p->t_stack_top].pending_c);
#else
    pthread_cond_signal(&p->pending_c);
#endif

    pthread_mutex_unlock(&p->pool_m);

    return 0;
}